

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O1

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_1::createSubresourceRangeTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,VkImageViewType viewType,
          VkFormat imageFormat)

{
  VkImageSubresourceRange *pVVar1;
  char *pcVar2;
  uint uVar3;
  TestNode *pTVar4;
  ostream *poVar5;
  ImageViewTest *pIVar6;
  ulong uVar7;
  long lVar8;
  long *local_3d0;
  long local_3c0 [2];
  TestNode *local_3b0;
  TestCaseConfig config;
  TestCaseConfig mipLevelRangeCases [2];
  TestCaseConfig arrayRangeCases [3];
  TestCaseConfig mipLevelAndArrayRemainingRangeCases [3];
  TestCaseConfig mipLevelAndArrayRangeCases [6];
  ostringstream desc;
  ios_base local_138 [264];
  
  uVar7 = (ulong)viewType;
  uVar3 = ImageViewTest::getNumLevels(viewType);
  mipLevelRangeCases[1].subresourceRange.layerCount = 6;
  if (viewType - VK_IMAGE_VIEW_TYPE_3D < 5) {
    mipLevelRangeCases[1].subresourceRange.layerCount =
         *(deUint32 *)(&DAT_00b110c8 + (ulong)(viewType - VK_IMAGE_VIEW_TYPE_3D) * 4);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,testCtx,"subresource_range","");
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data.ptr =
       (TestCaseGroup *)pTVar4;
  local_3b0 = (TestNode *)uVar7;
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
    mipLevelRangeCases[0].name = "lod_base_mip_level";
    mipLevelRangeCases[0].samplerLod = 0.0;
    mipLevelRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelRangeCases[0].subresourceRange.levelCount = uVar3 - 2;
    lVar8 = 0;
    mipLevelRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelRangeCases[1].name = "lod_mip_levels";
    mipLevelRangeCases[1].samplerLod = 4.0;
    mipLevelRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].name = "base_array_layer";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[0].subresourceRange.layerCount =
         mipLevelRangeCases[1].subresourceRange.layerCount - 1;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    arrayRangeCases[1].name = "array_size";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 4;
    arrayRangeCases[2].name = "array_base_and_size";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[2].subresourceRange.baseArrayLayer = 2;
    arrayRangeCases[2].subresourceRange.layerCount = 3;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 5;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 5;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 4;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 4;
    mipLevelAndArrayRangeCases[4].name = "lod_base_mip_level_array_base_and_size";
    mipLevelAndArrayRangeCases[4].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[4].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[4].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[4].subresourceRange.baseArrayLayer = 2;
    mipLevelAndArrayRangeCases[4].subresourceRange.layerCount = 3;
    mipLevelAndArrayRangeCases[5].name = "lod_mip_levels_array_base_and_size";
    mipLevelAndArrayRangeCases[5].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[5].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[5].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[5].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[5].subresourceRange.baseArrayLayer = 2;
    mipLevelAndArrayRangeCases[5].subresourceRange.layerCount = 3;
    mipLevelAndArrayRemainingRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    mipLevelAndArrayRemainingRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelAndArrayRemainingRangeCases[1].name = "base_array_layer_remaining_layers";
    mipLevelAndArrayRemainingRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[2].name =
         "lod_base_mip_level_base_array_layer_remaining_levels_and_layers";
    mipLevelAndArrayRemainingRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.baseArrayLayer = 2;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    pVVar1 = &config.subresourceRange;
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    mipLevelAndArrayRangeCases[4].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0xc0);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRemainingRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)
                      ((long)&mipLevelAndArrayRemainingRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    mipLevelRangeCases[0].name = "lod_base_mip_level";
    mipLevelRangeCases[0].samplerLod = 0.0;
    mipLevelRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelRangeCases[0].subresourceRange.levelCount = uVar3 - 2;
    lVar8 = 0;
    mipLevelRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelRangeCases[1].name = "lod_mip_levels";
    mipLevelRangeCases[1].samplerLod = 4.0;
    mipLevelRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].name = "base_array_layer";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[0].subresourceRange.layerCount =
         mipLevelRangeCases[1].subresourceRange.layerCount - 6;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    arrayRangeCases[1].name = "array_size";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 6;
    arrayRangeCases[2].name = "array_base_and_size";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[2].subresourceRange.baseArrayLayer = 0xc;
    arrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount =
         arrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount =
         arrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[4].name = "lod_base_mip_level_array_base_and_size";
    mipLevelAndArrayRangeCases[4].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[4].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[4].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[4].subresourceRange.baseArrayLayer = 0xc;
    mipLevelAndArrayRangeCases[4].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[5].name = "lod_mip_levels_array_base_and_size";
    mipLevelAndArrayRangeCases[5].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[5].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[5].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[5].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[5].subresourceRange.baseArrayLayer = 0xc;
    mipLevelAndArrayRangeCases[5].subresourceRange.layerCount = 6;
    mipLevelAndArrayRemainingRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    mipLevelAndArrayRemainingRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelAndArrayRemainingRangeCases[1].name = "base_array_layer_remaining_layers";
    mipLevelAndArrayRemainingRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[2].name =
         "lod_base_mip_level_base_array_layer_remaining_levels_and_layers";
    mipLevelAndArrayRemainingRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.baseArrayLayer = 0xc;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    pVVar1 = &config.subresourceRange;
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    mipLevelAndArrayRangeCases[4].subresourceRange.levelCount =
         mipLevelRangeCases[0].subresourceRange.levelCount;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0xc0);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRemainingRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)
                      ((long)&mipLevelAndArrayRemainingRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
  }
  else if (viewType < VK_IMAGE_VIEW_TYPE_3D) {
    mipLevelAndArrayRemainingRangeCases[0].name = "lod_base_mip_level";
    mipLevelAndArrayRemainingRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount = uVar3 - 2;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.layerCount = 1;
    mipLevelAndArrayRemainingRangeCases[1].name = "lod_mip_levels";
    mipLevelAndArrayRemainingRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.layerCount = 1;
    mipLevelRangeCases[0].name = "array_layer_second";
    mipLevelRangeCases[0].samplerLod = 0.0;
    mipLevelRangeCases[0].subresourceRange.aspectMask = 1;
    lVar8 = 0;
    mipLevelRangeCases[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases[0].subresourceRange.baseArrayLayer = 1;
    mipLevelRangeCases[0].subresourceRange.layerCount = 1;
    mipLevelRangeCases[1].name = "array_layer_last";
    mipLevelRangeCases[1].samplerLod = 0.0;
    mipLevelRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    mipLevelRangeCases[1].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.layerCount - 1;
    mipLevelRangeCases[1].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
         mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 5;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].subresourceRange.layerCount = 1;
    arrayRangeCases[1].name = "array_layer_last_remaining_layers";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[1].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    pVVar1 = &config.subresourceRange;
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    mipLevelRangeCases[0].subresourceRange.levelCount = uVar3;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRemainingRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)
                      ((long)&mipLevelAndArrayRemainingRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,(VkImageViewType)local_3b0,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
    arrayRangeCases[0].name = "lod_base_mip_level";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.levelCount = uVar3 - 2;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    lVar8 = 0;
    arrayRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    arrayRangeCases[1].name = "lod_mip_levels";
    arrayRangeCases[1].samplerLod = 4.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.levelCount = 3;
    arrayRangeCases[1].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRangeCases[0].subresourceRange._12_8_ =
         (ulong)mipLevelRangeCases[1].subresourceRange.layerCount << 0x20;
    mipLevelAndArrayRangeCases[1].name = "single_array_layer_remaining_layers";
    mipLevelAndArrayRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    mipLevelAndArrayRangeCases[2].name =
         "lod_base_mip_level_single_array_layer_remaining_levels_and_layers";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      mipLevelAndArrayRemainingRangeCases[0].name =
           *(char **)((long)&arrayRangeCases[0].name + lVar8);
      mipLevelAndArrayRemainingRangeCases[0]._8_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar8);
      mipLevelAndArrayRemainingRangeCases[0].subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      mipLevelAndArrayRemainingRangeCases[0].subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>
                         ((double)mipLevelAndArrayRemainingRangeCases[0].samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,&mipLevelAndArrayRemainingRangeCases[0].subresourceRange);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = mipLevelAndArrayRemainingRangeCases[0].name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,mipLevelRangeCases[0].name,VK_IMAGE_VIEW_TYPE_3D,imageFormat,
                 mipLevelAndArrayRemainingRangeCases[0].samplerLod,
                 (VkComponentMapping *)&DAT_00afde40,
                 &mipLevelAndArrayRemainingRangeCases[0].subresourceRange);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if ((deUint32 *)mipLevelRangeCases[0].name !=
          &mipLevelRangeCases[0].subresourceRange.baseMipLevel) {
        operator_delete(mipLevelRangeCases[0].name,
                        CONCAT44(mipLevelRangeCases[0].subresourceRange.levelCount,
                                 mipLevelRangeCases[0].subresourceRange.baseMipLevel) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    pTVar4 = &((__return_storage_ptr__->
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data
              .ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      mipLevelAndArrayRemainingRangeCases[0].name =
           *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar8);
      mipLevelAndArrayRemainingRangeCases[0]._8_8_ =
           *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar8);
      mipLevelAndArrayRemainingRangeCases[0].subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      mipLevelAndArrayRemainingRangeCases[0].subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>
                         ((double)mipLevelAndArrayRemainingRangeCases[0].samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,&mipLevelAndArrayRemainingRangeCases[0].subresourceRange);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = mipLevelAndArrayRemainingRangeCases[0].name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,mipLevelRangeCases[0].name,VK_IMAGE_VIEW_TYPE_3D,imageFormat,
                 mipLevelAndArrayRemainingRangeCases[0].samplerLod,
                 (VkComponentMapping *)&DAT_00afde40,
                 &mipLevelAndArrayRemainingRangeCases[0].subresourceRange);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
      if ((deUint32 *)mipLevelRangeCases[0].name !=
          &mipLevelRangeCases[0].subresourceRange.baseMipLevel) {
        operator_delete(mipLevelRangeCases[0].name,
                        CONCAT44(mipLevelRangeCases[0].subresourceRange.levelCount,
                                 mipLevelRangeCases[0].subresourceRange.baseMipLevel) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE) {
    mipLevelAndArrayRemainingRangeCases[0].name = "lod_base_mip_level";
    mipLevelAndArrayRemainingRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount = uVar3 - 2;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.layerCount = 6;
    mipLevelAndArrayRemainingRangeCases[1].name = "lod_mip_levels";
    mipLevelAndArrayRemainingRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.layerCount = 6;
    mipLevelRangeCases[0].name = "array_layer_second";
    mipLevelRangeCases[0].samplerLod = 0.0;
    mipLevelRangeCases[0].subresourceRange.aspectMask = 1;
    lVar8 = 0;
    mipLevelRangeCases[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases[0].subresourceRange.baseArrayLayer = 6;
    mipLevelRangeCases[0].subresourceRange.layerCount = 6;
    mipLevelRangeCases[1].name = "array_layer_last";
    mipLevelRangeCases[1].samplerLod = 0.0;
    mipLevelRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    mipLevelRangeCases[1].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.layerCount - 6;
    mipLevelRangeCases[1].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount =
         mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].subresourceRange.layerCount = 6;
    arrayRangeCases[1].name = "array_layer_last_remaining_layers";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange._4_8_ = (ulong)uVar3 << 0x20;
    arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[1].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.baseArrayLayer =
         mipLevelRangeCases[1].subresourceRange.baseArrayLayer;
    pVVar1 = &config.subresourceRange;
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    mipLevelRangeCases[0].subresourceRange.levelCount = uVar3;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRemainingRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)
                      ((long)&mipLevelAndArrayRemainingRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&mipLevelRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x80);
    local_3b0 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
    lVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar8);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar8);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar8);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar5 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with :\n",8);
      ::vk::operator<<(poVar5,pVVar1);
      pIVar6 = (ImageViewTest *)operator_new(0xa0);
      pcVar2 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar6,testCtx,pcVar2,(char *)local_3d0,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00afde40,pVVar1);
      tcu::TestNode::addChild(local_3b0,(TestNode *)pIVar6);
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0,local_3c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x60);
  }
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<tcu::TestCaseGroup> createSubresourceRangeTests(tcu::TestContext& testCtx, VkImageViewType viewType, VkFormat imageFormat)
{
	struct TestCaseConfig
	{
		const char*				name;
		float					samplerLod;
		VkImageSubresourceRange	subresourceRange;
	};

	const deUint32				numLevels				= ImageViewTest::getNumLevels(viewType);
	const deUint32				arraySize				= ImageViewTest::getArraySize(viewType);
	const VkImageAspectFlags	imageAspectFlags		= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkComponentMapping	componentMapping		= { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A };

	de::MovePtr<tcu::TestCaseGroup> rangeTests (new tcu::TestCaseGroup(testCtx, "subresource_range", ""));

#define ADD_SUBRESOURCE_RANGE_TESTS(TEST_CASES)															\
	do {																								\
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(TEST_CASES); configNdx++)				\
		{																								\
			std::ostringstream		desc;																\
			const TestCaseConfig	config	= (TEST_CASES)[configNdx];									\
			desc << "Samples level " << config.samplerLod << " with :\n" << config.subresourceRange;	\
			rangeTests->addChild(new ImageViewTest(testCtx, config.name, desc.str().c_str(), viewType,	\
												   imageFormat, config.samplerLod, componentMapping,	\
												   config.subresourceRange));							\
		}																								\
	} while (deGetFalse())

	if (viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY || viewType == VK_IMAGE_VIEW_TYPE_2D_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, arraySize - 1u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 4u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 1u, 5u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 1u, 5u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 4u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 4u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 2u, 3u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	2u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, arraySize - 6u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 6u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 6u, arraySize - 6u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 6u, arraySize - 6u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 6u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 12u, 6u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,		arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					6u,		VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	12u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_2D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 1u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 1u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, 1u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 1u, 1u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 5u, 1u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				1u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 6u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, 6u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 6u, 6u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, 6u, 6u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, arraySize - 6u, 6u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				6u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_3D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "single_array_layer_remaining_layers",								0.0f,		{ imageAspectFlags,	0u,	numLevels,					0u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_single_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	0u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}

#undef ADD_SUBRESOURCE_RANGE_TESTS

	return rangeTests;
}